

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::DtlsSession::Handshake(Error *__return_storage_ptr__,DtlsSession *this)

{
  bool bVar1;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  Error local_1c0;
  undefined1 local_198 [15];
  v10 local_189;
  v10 *local_188;
  char *local_180;
  string local_178;
  allocator local_151;
  string local_150;
  Error local_130;
  Error local_108;
  undefined1 local_cd;
  int local_cc;
  DtlsSession *pDStack_c8;
  int rval;
  DtlsSession *this_local;
  Error *error;
  undefined1 local_a0 [16];
  v10 *local_90;
  char *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *local_80;
  v10 *local_78;
  char *pcStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  local_cc = 0;
  local_cd = 0;
  pDStack_c8 = this;
  this_local = (DtlsSession *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  if (this->mState == kConnecting) {
    local_cc = mbedtls_ssl_handshake(&this->mSsl);
    if ((this->mState == kConnecting) && ((this->mSsl).state == 0x1b)) {
      this->mState = kConnected;
      bVar1 = std::operator!=(&this->mOnConnected,(nullptr_t)0x0);
      if (bVar1) {
        Error::Error(&local_108);
        std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator()
                  (&this->mOnConnected,this,&local_108);
        Error::~Error(&local_108);
        std::function<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error)>::operator=
                  (&this->mOnConnected,(nullptr_t)0x0);
      }
    }
    if (local_cc == -0x6a80) {
      Reconnect(this);
      Error::Error(&local_130);
      Error::operator=(__return_storage_ptr__,&local_130);
      Error::~Error(&local_130);
    }
    else {
      if (local_cc == -0x6800) {
        std::allocator<char>::allocator();
        this_00 = (v10 *)0x3b262e;
        std::__cxx11::string::string((string *)&local_150,"dtls",&local_151);
        Handshake::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)(local_198 + 0xe))
        ;
        local_58 = &local_188;
        local_60 = &local_189;
        bVar2 = ::fmt::v10::operator()(local_60);
        local_180 = (char *)bVar2.size_;
        local_188 = (v10 *)bVar2.data_;
        ::fmt::v10::detail::check_format_string<void_*,_FMT_COMPILE_STRING,_0>();
        local_68 = &local_178;
        local_78 = local_188;
        pcStack_70 = local_180;
        local_80 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*>
                    *)local_198;
        local_50 = &local_78;
        local_90 = local_188;
        local_88 = local_180;
        local_198._0_8_ = this;
        local_48 = local_90;
        pcStack_40 = local_88;
        error = (Error *)::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*>
                                   (local_80,this_00,(void **)local_68);
        local_30 = local_a0;
        local_38 = &error;
        local_20 = 0xe;
        fmt.size_ = 0xe;
        fmt.data_ = local_88;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_38;
        local_28 = local_38;
        local_18 = local_30;
        local_10 = local_38;
        ::fmt::v10::vformat_abi_cxx11_(&local_178,local_90,fmt,args);
        Log(kError,&local_150,&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_150);
        std::allocator<char>::~allocator((allocator<char> *)&local_151);
      }
      ErrorFromMbedtlsError(&local_1c0,local_cc);
      Error::operator=(__return_storage_ptr__,&local_1c0);
      Error::~Error(&local_1c0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error DtlsSession::Handshake()
{
    int   rval = 0;
    Error error;

    VerifyOrExit(mState == State::kConnecting);

    rval = mbedtls_ssl_handshake(&mSsl);

    if (mState == State::kConnecting && mSsl.state == MBEDTLS_SSL_HANDSHAKE_OVER)
    {
        mState = State::kConnected;
        if (mOnConnected != nullptr)
        {
            mOnConnected(*this, ERROR_NONE);
            mOnConnected = nullptr;
        }
    }

    switch (rval)
    {
    case MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED:
        Reconnect();
        error = ERROR_NONE;
        break;

    case MBEDTLS_ERR_SSL_TIMEOUT:
        LOG_ERROR(LOG_REGION_DTLS, "session(={}) handshake timeout", static_cast<void *>(this));

        // Fall through

    default:
        error = ErrorFromMbedtlsError(rval);
        break;
    }

exit:
    return error;
}